

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tiled_Image.cxx
# Opt level: O0

void __thiscall Fl_Tiled_Image::Fl_Tiled_Image(Fl_Tiled_Image *this,Fl_Image *i,int W,int H)

{
  int H_local;
  int W_local;
  Fl_Image *i_local;
  Fl_Tiled_Image *this_local;
  
  Fl_Image::Fl_Image(&this->super_Fl_Image,W,H,0);
  (this->super_Fl_Image)._vptr_Fl_Image = (_func_int **)&PTR__Fl_Tiled_Image_002ef9a0;
  this->image_ = i;
  this->alloc_image_ = 0;
  return;
}

Assistant:

Fl_Tiled_Image::Fl_Tiled_Image(Fl_Image *i,	// I - Image to tile
                               int      W,	// I - Width of tiled area
			       int      H) :	// I - Height of tiled area
  Fl_Image(W,H,0) {
  image_       = i;
  alloc_image_ = 0;

  // giving to the tiled image the screen size may fail with multiscreen
  // configurations, so we leave it with w = h = 0 (STR #3106)
  // if (W == 0) w(Fl::w());
  // if (H == 0) h(Fl::h());
}